

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void HUF_fillDTableX2ForWeight
               (HUF_DEltX2 *DTableRank,sortedSymbol_t *begin,sortedSymbol_t *end,U32 nbBits,
               U32 tableLog,U16 baseSeq,int level)

{
  HUF_DEltX2 *pHVar1;
  HUF_DEltX2 HVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  
  uVar3 = 1 << ((char)tableLog - (char)nbBits & 0x1fU);
  switch(uVar3) {
  case 1:
    if (begin != end) {
      do {
        uVar3 = (uint)begin->symbol * 0x100 + (uint)baseSeq;
        if (level == 1) {
          uVar3 = (uint)begin->symbol;
        }
        *DTableRank = (HUF_DEltX2)(uVar3 + level * 0x1000000 + nbBits * 0x10000);
        DTableRank = DTableRank + 1;
        begin = begin + 1;
      } while (begin != end);
    }
    break;
  case 2:
    if (begin != end) {
      do {
        uVar3 = (uint)begin->symbol * 0x100 + (uint)baseSeq;
        if (level == 1) {
          uVar3 = (uint)begin->symbol;
        }
        HVar2 = (HUF_DEltX2)(uVar3 + level * 0x1000000 + nbBits * 0x10000);
        *DTableRank = HVar2;
        DTableRank[1] = HVar2;
        DTableRank = DTableRank + 2;
        begin = begin + 1;
      } while (begin != end);
    }
    break;
  default:
    if (begin != end) {
      do {
        uVar4 = (uint)begin->symbol * 0x100 + (uint)baseSeq;
        if (level == 1) {
          uVar4 = (uint)begin->symbol;
        }
        lVar5 = (ulong)(uVar4 + level * 0x1000000 + nbBits * 0x10000) * 0x100000001;
        pHVar1 = DTableRank + uVar3;
        do {
          *(long *)DTableRank = lVar5;
          *(long *)(DTableRank + 2) = lVar5;
          *(long *)(DTableRank + 4) = lVar5;
          *(long *)(DTableRank + 6) = lVar5;
          DTableRank = DTableRank + 8;
        } while (DTableRank != pHVar1);
        begin = begin + 1;
      } while (begin != end);
    }
    break;
  case 4:
    if (begin != end) {
      do {
        uVar3 = (uint)begin->symbol * 0x100 + (uint)baseSeq;
        if (level == 1) {
          uVar3 = (uint)begin->symbol;
        }
        lVar5 = (ulong)(uVar3 + level * 0x1000000 + nbBits * 0x10000) * 0x100000001;
        *(long *)DTableRank = lVar5;
        *(long *)(DTableRank + 2) = lVar5;
        DTableRank = DTableRank + 4;
        begin = begin + 1;
      } while (begin != end);
    }
    break;
  case 8:
    if (begin != end) {
      do {
        uVar3 = (uint)begin->symbol * 0x100 + (uint)baseSeq;
        if (level == 1) {
          uVar3 = (uint)begin->symbol;
        }
        lVar5 = (ulong)(uVar3 + level * 0x1000000 + nbBits * 0x10000) * 0x100000001;
        *(long *)DTableRank = lVar5;
        *(long *)(DTableRank + 2) = lVar5;
        *(long *)(DTableRank + 4) = lVar5;
        *(long *)(DTableRank + 6) = lVar5;
        DTableRank = DTableRank + 8;
        begin = begin + 1;
      } while (begin != end);
    }
  }
  return;
}

Assistant:

static void HUF_fillDTableX2ForWeight(
    HUF_DEltX2* DTableRank,
    sortedSymbol_t const* begin, sortedSymbol_t const* end,
    U32 nbBits, U32 tableLog,
    U16 baseSeq, int const level)
{
    U32 const length = 1U << ((tableLog - nbBits) & 0x1F /* quiet static-analyzer */);
    const sortedSymbol_t* ptr;
    assert(level >= 1 && level <= 2);
    switch (length) {
    case 1:
        for (ptr = begin; ptr != end; ++ptr) {
            HUF_DEltX2 const DElt = HUF_buildDEltX2(ptr->symbol, nbBits, baseSeq, level);
            *DTableRank++ = DElt;
        }
        break;
    case 2:
        for (ptr = begin; ptr != end; ++ptr) {
            HUF_DEltX2 const DElt = HUF_buildDEltX2(ptr->symbol, nbBits, baseSeq, level);
            DTableRank[0] = DElt;
            DTableRank[1] = DElt;
            DTableRank += 2;
        }
        break;
    case 4:
        for (ptr = begin; ptr != end; ++ptr) {
            U64 const DEltX2 = HUF_buildDEltX2U64(ptr->symbol, nbBits, baseSeq, level);
            ZSTD_memcpy(DTableRank + 0, &DEltX2, sizeof(DEltX2));
            ZSTD_memcpy(DTableRank + 2, &DEltX2, sizeof(DEltX2));
            DTableRank += 4;
        }
        break;
    case 8:
        for (ptr = begin; ptr != end; ++ptr) {
            U64 const DEltX2 = HUF_buildDEltX2U64(ptr->symbol, nbBits, baseSeq, level);
            ZSTD_memcpy(DTableRank + 0, &DEltX2, sizeof(DEltX2));
            ZSTD_memcpy(DTableRank + 2, &DEltX2, sizeof(DEltX2));
            ZSTD_memcpy(DTableRank + 4, &DEltX2, sizeof(DEltX2));
            ZSTD_memcpy(DTableRank + 6, &DEltX2, sizeof(DEltX2));
            DTableRank += 8;
        }
        break;
    default:
        for (ptr = begin; ptr != end; ++ptr) {
            U64 const DEltX2 = HUF_buildDEltX2U64(ptr->symbol, nbBits, baseSeq, level);
            HUF_DEltX2* const DTableRankEnd = DTableRank + length;
            for (; DTableRank != DTableRankEnd; DTableRank += 8) {
                ZSTD_memcpy(DTableRank + 0, &DEltX2, sizeof(DEltX2));
                ZSTD_memcpy(DTableRank + 2, &DEltX2, sizeof(DEltX2));
                ZSTD_memcpy(DTableRank + 4, &DEltX2, sizeof(DEltX2));
                ZSTD_memcpy(DTableRank + 6, &DEltX2, sizeof(DEltX2));
            }
        }
        break;
    }
}